

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_kexact_gradient_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *gradient,REF_DBL *hessian)

{
  REF_NODE ref_node_00;
  uint uVar1;
  REF_CLOUD *one_layer_00;
  REF_GLOB local_e0;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT layer;
  REF_CLOUD *one_layer;
  REF_STATUS status;
  REF_DBL node_hessian [6];
  REF_DBL node_gradient [3];
  REF_CLOUD ref_cloud;
  REF_INT im;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *hessian_local;
  REF_DBL *gradient_local;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  _im = ref_grid->cell[8];
  if (ref_grid->twod != 0) {
    _im = ref_grid->cell[3];
  }
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca,
           "ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    one_layer_00 = (REF_CLOUD *)malloc((long)ref_node_00->max << 3);
    if (one_layer_00 == (REF_CLOUD *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca
             ,"ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        one_layer_00[ref_private_macro_code_rss_1] = (REF_CLOUD)0x0;
      }
      for (ref_cloud._4_4_ = 0; ref_cloud._4_4_ < ref_node_00->max;
          ref_cloud._4_4_ = ref_cloud._4_4_ + 1) {
        if ((((-1 < ref_cloud._4_4_) && (ref_cloud._4_4_ < ref_node_00->max)) &&
            (-1 < ref_node_00->global[ref_cloud._4_4_])) &&
           (uVar1 = ref_cloud_create(one_layer_00 + ref_cloud._4_4_,4), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x3cc,"ref_recon_kexact_gradient_hessian",(ulong)uVar1,"cloud storage");
          return uVar1;
        }
      }
      ref_grid_local._4_4_ = ref_recon_local_immediate_cloud(one_layer_00,ref_node_00,_im,scalar);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_recon_ghost_cloud(one_layer_00,ref_node_00);
        if (ref_grid_local._4_4_ == 0) {
          for (ref_cloud._4_4_ = 0; ref_cloud._4_4_ < ref_node_00->max;
              ref_cloud._4_4_ = ref_cloud._4_4_ + 1) {
            if (((-1 < ref_cloud._4_4_) && (ref_cloud._4_4_ < ref_node_00->max)) &&
               ((-1 < ref_node_00->global[ref_cloud._4_4_] &&
                (ref_node_00->ref_mpi->id == ref_node_00->part[ref_cloud._4_4_])))) {
              uVar1 = ref_cloud_deep_copy((REF_CLOUD *)(node_gradient + 2),
                                          one_layer_00[ref_cloud._4_4_]);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x3d6,"ref_recon_kexact_gradient_hessian",(ulong)uVar1,"create ref_cloud");
                return uVar1;
              }
              one_layer._4_4_ = 3;
              for (ref_private_macro_code_rss = 2;
                  one_layer._4_4_ != 0 && ref_private_macro_code_rss < 9;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                uVar1 = ref_recon_grow_cloud_one_layer
                                  ((REF_CLOUD)node_gradient[2],one_layer_00,ref_node_00);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x3da,"ref_recon_kexact_gradient_hessian",(ulong)uVar1,"grow");
                  return uVar1;
                }
                if (((ref_cloud._4_4_ < 0) || (ref_node_00->max <= ref_cloud._4_4_)) ||
                   (ref_node_00->global[ref_cloud._4_4_] < 0)) {
                  local_e0 = -1;
                }
                else {
                  local_e0 = ref_node_00->global[ref_cloud._4_4_];
                }
                one_layer._4_4_ =
                     ref_recon_kexact_with_aux
                               (local_e0,(REF_CLOUD)node_gradient[2],ref_grid->twod,node_hessian + 5
                                ,(REF_DBL *)&stack0xffffffffffffff68);
                if (one_layer._4_4_ == 5) {
                  ref_node_location(ref_node_00,ref_cloud._4_4_);
                  printf(" caught %s, for %d layers to kexact cloud; zero gradient and hessian\n",
                         "REF_NOT_FOUND",(ulong)(uint)ref_private_macro_code_rss);
                  break;
                }
                if ((one_layer._4_4_ == 4) && (4 < ref_private_macro_code_rss)) {
                  ref_node_location(ref_node_00,ref_cloud._4_4_);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_DIV_ZERO",
                         (ulong)(uint)ref_private_macro_code_rss);
                }
                if ((one_layer._4_4_ == 8) && (4 < ref_private_macro_code_rss)) {
                  ref_node_location(ref_node_00,ref_cloud._4_4_);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_ILL_CONDITIONED",
                         (ulong)(uint)ref_private_macro_code_rss);
                }
              }
              if (gradient != (REF_DBL *)0x0) {
                if (ref_grid->twod != 0) {
                  node_gradient[1] = 0.0;
                }
                for (ref_cloud._0_4_ = 0; (int)ref_cloud < 3; ref_cloud._0_4_ = (int)ref_cloud + 1)
                {
                  gradient[(int)ref_cloud + ref_cloud._4_4_ * 3] =
                       node_hessian[(long)(int)ref_cloud + 5];
                }
              }
              if (hessian != (REF_DBL *)0x0) {
                if (ref_grid->twod != 0) {
                  node_hessian[1] = 0.0;
                  node_hessian[3] = 0.0;
                  node_hessian[4] = 0.0;
                }
                for (ref_cloud._0_4_ = 0; (int)ref_cloud < 6; ref_cloud._0_4_ = (int)ref_cloud + 1)
                {
                  hessian[(int)ref_cloud + ref_cloud._4_4_ * 6] =
                       node_hessian[(long)(int)ref_cloud + -1];
                }
              }
              uVar1 = ref_cloud_free((REF_CLOUD)node_gradient[2]);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x404,"ref_recon_kexact_gradient_hessian",(ulong)uVar1,"free ref_cloud");
                return uVar1;
              }
            }
          }
          for (ref_cloud._4_4_ = 0; ref_cloud._4_4_ < ref_node_00->max;
              ref_cloud._4_4_ = ref_cloud._4_4_ + 1) {
            if (((-1 < ref_cloud._4_4_) && (ref_cloud._4_4_ < ref_node_00->max)) &&
               (-1 < ref_node_00->global[ref_cloud._4_4_])) {
              ref_cloud_free(one_layer_00[ref_cloud._4_4_]);
            }
          }
          if (one_layer_00 != (REF_CLOUD *)0x0) {
            free(one_layer_00);
          }
          if ((gradient == (REF_DBL *)0x0) ||
             (ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,gradient,3),
             ref_grid_local._4_4_ == 0)) {
            if ((hessian == (REF_DBL *)0x0) ||
               (ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,hessian,6),
               ref_grid_local._4_4_ == 0)) {
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x412,"ref_recon_kexact_gradient_hessian",(ulong)ref_grid_local._4_4_,
                     "update ghosts");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x40e,"ref_recon_kexact_gradient_hessian",(ulong)ref_grid_local._4_4_,
                   "update ghosts");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x3d1,"ref_recon_kexact_gradient_hessian",(ulong)ref_grid_local._4_4_,"fill ghosts"
                );
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x3d0,"ref_recon_kexact_gradient_hessian",(ulong)ref_grid_local._4_4_,
               "fill immediate cloud");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_kexact_gradient_hessian(REF_GRID ref_grid,
                                                            REF_DBL *scalar,
                                                            REF_DBL *gradient,
                                                            REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL node_gradient[3], node_hessian[6];
  REF_STATUS status;
  REF_CLOUD *one_layer;
  REF_INT layer;

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }

  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");
        status = ref_recon_kexact_with_aux(ref_node_global(ref_node, node),
                                           ref_cloud, ref_grid_twod(ref_grid),
                                           node_gradient, node_hessian);
        if (REF_NOT_FOUND == status) {
          ref_node_location(ref_node, node);
          printf(
              " caught %s, for %d layers to kexact cloud; "
              "zero gradient and hessian\n",
              "REF_NOT_FOUND", layer);
          status = REF_SUCCESS;
          break;
        }
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      if (NULL != gradient) {
        if (ref_grid_twod(ref_grid)) {
          node_gradient[2] = 0.0;
        }
        for (im = 0; im < 3; im++) {
          gradient[im + 3 * node] = node_gradient[im];
        }
      }
      if (NULL != hessian) {
        if (ref_grid_twod(ref_grid)) {
          node_hessian[2] = 0.0;
          node_hessian[4] = 0.0;
          node_hessian[5] = 0.0;
        }
        for (im = 0; im < 6; im++) {
          hessian[im + 6 * node] = node_hessian[im];
        }
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  if (NULL != gradient) {
    RSS(ref_node_ghost_dbl(ref_node, gradient, 3), "update ghosts");
  }

  if (NULL != hessian) {
    RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");
  }

  return REF_SUCCESS;
}